

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_rfc5444.c
# Opt level: O3

oonf_rfc5444_target * oonf_rfc5444_add_target(oonf_rfc5444_interface *interf,netaddr *dst)

{
  oonf_log_source source;
  avl_node *paVar1;
  oonf_rfc5444_target *poVar2;
  char *pcVar3;
  netaddr_str nbuf;
  
  paVar1 = avl_find(&interf->_target_tree,dst);
  if (paVar1 == (avl_node *)0x0) {
    poVar2 = _create_target(interf,dst,true);
    if (poVar2 == (oonf_rfc5444_target *)0x0) {
      return (oonf_rfc5444_target *)0x0;
    }
    (poVar2->_node).key = &poVar2->dst;
    avl_insert(&interf->_target_tree,&poVar2->_node);
  }
  else {
    poVar2 = (oonf_rfc5444_target *)&paVar1[-3].list.prev;
  }
  source = _oonf_rfc5444_subsystem.logging;
  if ((log_global_mask[_oonf_rfc5444_subsystem.logging] & 2) != 0) {
    pcVar3 = netaddr_to_prefixstring(&nbuf,dst,false);
    oonf_log(LOG_SEVERITY_INFO,source,"src/base/oonf_rfc5444.c",0x341,(void *)0x0,0,
             "Add target %s to interface %s on protocol %s (refcount was %d)",pcVar3,interf,
             interf->protocol,(ulong)(uint)poVar2->_refcount);
  }
  interf->_refcount = interf->_refcount + 1;
  return poVar2;
}

Assistant:

struct oonf_rfc5444_target *
oonf_rfc5444_add_target(struct oonf_rfc5444_interface *interf, struct netaddr *dst) {
  struct oonf_rfc5444_target *target;
#ifdef OONF_LOG_INFO
  struct netaddr_str nbuf;
#endif

  target = avl_find_element(&interf->_target_tree, dst, target, _node);
  if (!target) {
    target = _create_target(interf, dst, true);
    if (target == NULL) {
      return NULL;
    }

    /* hook into interface tree */
    target->_node.key = &target->dst;
    avl_insert(&interf->_target_tree, &target->_node);
  }

  OONF_INFO(LOG_RFC5444, "Add target %s to interface %s on protocol %s (refcount was %d)",
    netaddr_to_string(&nbuf, dst), interf->name, interf->protocol->name, target->_refcount);

  /* increase interface refcount */
  interf->_refcount++;
  return target;
}